

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O1

int amqp_ssl_socket_set_key_engine(amqp_socket_t *base,char *cert,char *key)

{
  int iVar1;
  EVP_PKEY *pkey;
  int iVar2;
  
  if (base->klass == &amqp_ssl_socket_class) {
    iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)base[1].klass,cert);
    iVar2 = -0x200;
    if (iVar1 == 1) {
      pkey = ENGINE_load_private_key((ENGINE *)openssl_engine,key,(UI_METHOD *)0x0,(void *)0x0);
      if (pkey != (EVP_PKEY *)0x0) {
        iVar1 = SSL_CTX_use_PrivateKey((SSL_CTX *)base[1].klass,pkey);
        EVP_PKEY_free(pkey);
        iVar2 = (uint)(iVar1 == 1) * 0x200 + -0x200;
      }
    }
    return iVar2;
  }
  amqp_abort("<%p> is not of type amqp_ssl_socket_t",base);
}

Assistant:

int amqp_ssl_socket_set_key_engine(amqp_socket_t *base, const char *cert,
                                   const char *key) {
#ifdef ENABLE_SSL_ENGINE_API
  int status;
  struct amqp_ssl_socket_t *self;
  EVP_PKEY *pkey = NULL;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }

  pkey = ENGINE_load_private_key(openssl_engine, key, NULL, NULL);
  if (pkey == NULL) {
    return AMQP_STATUS_SSL_ERROR;
  }

  status = SSL_CTX_use_PrivateKey(self->ctx, pkey);
  EVP_PKEY_free(pkey);

  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  return AMQP_STATUS_OK;
#else
  return AMQP_STATUS_SSL_UNIMPLEMENTED;
#endif
}